

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int detect_form(archive_read *a,int *is_form_d)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  byte *b;
  size_t len;
  void *pvVar7;
  ssize_t sVar8;
  ulong uVar9;
  int iVar10;
  size_t sVar11;
  size_t sVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  ulong uVar16;
  long len_00;
  byte *p;
  bool bVar17;
  ssize_t avail;
  ssize_t nl;
  int local_64;
  size_t local_58;
  int local_4c;
  ulong local_48;
  int local_3c;
  int *local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  b = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
  if (b == (byte *)0x0) {
    return -1;
  }
  iVar10 = 0;
  local_64 = 0;
  local_4c = 0;
  sVar11 = local_58;
  local_38 = is_form_d;
LAB_00492ce3:
  do {
    if (local_58 == 0) {
      local_48 = 0;
      len = 0;
    }
    else {
      len = get_line_size((char *)b,local_58,(ssize_t *)&local_48);
    }
    if ((local_48 == 0) && (len == local_58)) {
      bVar17 = false;
      do {
        sVar12 = local_58;
        uVar16 = (ulong)((int)sVar11 + 0x3ffU & 0xfffffc00);
        pvVar7 = __archive_read_ahead(a,uVar16 << (uVar16 < sVar11 + 0xa0),(ssize_t *)&local_58);
        if (pvVar7 == (void *)0x0) {
          if ((long)sVar11 < (long)local_58) {
            pvVar7 = __archive_read_ahead(a,local_58,(ssize_t *)&local_58);
            bVar17 = true;
            goto LAB_00492d7a;
          }
          bVar2 = false;
          b = (byte *)0x0;
        }
        else {
LAB_00492d7a:
          sVar3 = local_58;
          b = (byte *)((long)pvVar7 + (sVar11 - sVar12));
          local_58 = local_58 - (sVar11 - sVar12);
          sVar8 = get_line_size((char *)(b + len),local_58 - len,(ssize_t *)&local_48);
          sVar11 = 0;
          if (-1 < sVar8) {
            sVar11 = len;
          }
          len = sVar11 + sVar8;
          bVar2 = true;
          sVar11 = sVar3;
        }
        if (!bVar2) {
          len = 0;
          break;
        }
        if (((local_48 != 0) || (len != local_58)) || (bVar17)) break;
      } while( true );
    }
    uVar16 = local_48;
    if (((long)len < 1) || (local_48 == 0)) goto LAB_0049318f;
    if (local_64 == 0) {
      bVar17 = 0 < (long)len;
      if (0 < (long)len) {
        pbVar15 = b + len;
        do {
          sVar12 = local_58 - 1;
          if ((*b != 0x20) && (*b != 9)) goto LAB_00492e46;
          b = b + 1;
          bVar17 = 1 < (long)len;
          bVar2 = 1 < (long)len;
          len = len - 1;
          local_58 = sVar12;
        } while (bVar2);
        len = 0;
        b = pbVar15;
      }
LAB_00492e46:
      bVar1 = *b;
      if (bVar1 < 0x23) {
        if ((bVar1 == 10) || (bVar1 == 0xd)) {
LAB_00492e62:
          b = b + len;
          local_58 = local_58 - len;
          goto LAB_00492ce3;
        }
LAB_00492f69:
        pbVar15 = b + len;
        iVar4 = 0;
        bVar2 = false;
        p = b;
        if (bVar17) {
          uVar9 = (ulong)*b;
          if (bid_entry_safe_char[uVar9] == '\0') {
            bVar2 = false;
          }
          else {
            do {
              p = p + 1;
              if (pbVar15 <= p) {
                bVar2 = true;
                goto LAB_00492fe6;
              }
              uVar9 = (ulong)*p;
            } while (bid_entry_safe_char[uVar9] != '\0');
            bVar2 = true;
          }
          if ((0x20 < (byte)uVar9) || ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) {
            bVar2 = false;
          }
        }
LAB_00492fe6:
        sVar8 = (long)pbVar15 - (long)p;
        if (bVar2) {
LAB_004930e0:
          local_3c = iVar4;
          iVar6 = bid_keyword_list((char *)p,sVar8,0,iVar4);
          iVar4 = local_3c;
        }
        else {
          pbVar14 = pbVar15 + -local_48;
          if (((pbVar15 + -local_48 + -2 < b) || (pbVar14[-1] != 0x5c)) ||
             ((bVar1 = pbVar15[-local_48 + -2], bVar1 != 9 && (bVar1 != 0x20)))) {
            pbVar13 = pbVar14 + -1;
            bVar17 = true;
            if (pbVar13 < b) {
              uVar5 = 0;
LAB_00493039:
              if ((uVar5 == 0) || (bVar17)) goto LAB_004930d3;
              iVar4 = 0;
              bVar2 = false;
              if (*pbVar14 != 0x2f) {
                sVar8 = len - (uVar5 + local_48);
                bVar2 = true;
                iVar4 = 1;
                p = b;
              }
            }
            else {
              bVar2 = false;
              if (*pbVar13 != 0x5c) {
                uVar5 = 0;
                if (b <= pbVar13) {
                  bVar17 = false;
                  uVar5 = 0;
                  do {
                    bVar1 = *pbVar13;
                    if ((bVar1 == 9) || (bVar1 == 0x20)) break;
                    if (bid_entry_safe_char[bVar1] == '\0') goto LAB_004930d3;
                    uVar5 = uVar5 + 1;
                    if (bVar1 == 0x2f) {
                      bVar17 = true;
                    }
                    pbVar13 = pbVar13 + -1;
                  } while (b <= pbVar13);
                  pbVar14 = pbVar13 + 1;
                  bVar17 = !bVar17;
                }
                goto LAB_00493039;
              }
              iVar4 = 0;
            }
          }
          else {
LAB_004930d3:
            iVar4 = 0;
            bVar2 = false;
          }
          iVar6 = -1;
          if (bVar2) goto LAB_004930e0;
        }
        if (iVar6 < 0) {
LAB_00493132:
          bVar17 = false;
        }
        else {
          if (local_4c == 1) {
            local_4c = 1;
            if ((iVar4 == 0) && (iVar6 != 0)) goto LAB_00493132;
          }
          else if ((local_4c == 0) && (local_4c = 1, iVar4 == 0)) {
            local_4c = -(uint)(iVar6 != 0);
          }
          if ((iVar4 == 0) && (pbVar15[~uVar16] == 0x5c)) {
            bVar17 = true;
            local_64 = 1;
          }
          else {
            bVar17 = iVar10 < 2;
            iVar10 = iVar10 + 1;
          }
        }
        if (!bVar17) goto LAB_0049318f;
      }
      else {
        if (bVar1 == 0x23) goto LAB_00492e62;
        if (bVar1 != 0x2f) goto LAB_00492f69;
        if (((long)len < 5) || (iVar4 = strncmp((char *)b,"/set",4), iVar4 != 0)) {
          if (6 < (long)len) {
            iVar4 = strncmp((char *)b,"/unset",6);
            if (iVar4 == 0) {
              pbVar15 = b + 6;
              len_00 = len - 6;
              iVar4 = 1;
              goto LAB_00492f25;
            }
LAB_00493184:
            len = 1;
          }
LAB_0049318f:
          if (iVar10 < 3) {
            if (len != 0) {
              return 0;
            }
            if (iVar10 < 1) {
              return 0;
            }
          }
          if (local_38 == (int *)0x0) {
            return 0x20;
          }
          if (local_4c != 1) {
            return 0x20;
          }
          *local_38 = 1;
          return 0x20;
        }
        pbVar15 = b + 4;
        len_00 = len - 4;
        iVar4 = 0;
LAB_00492f25:
        iVar4 = bid_keyword_list((char *)pbVar15,len_00,iVar4,0);
        if (iVar4 < 1) goto LAB_00493184;
        if (b[~uVar16 + len] == 0x5c) {
          local_64 = 2;
        }
      }
      b = b + len;
      local_58 = local_58 - len;
      goto LAB_00492ce3;
    }
    iVar4 = bid_keyword_list((char *)b,len,0,0);
    if (iVar4 < 1) goto LAB_0049318f;
    b = b + len;
    if ((b[~uVar16] != 0x5c) && (bVar17 = local_64 == 1, local_64 = 0, bVar17)) {
      iVar4 = iVar10 + 1;
      bVar17 = 1 < iVar10;
      iVar10 = iVar4;
      local_64 = 0;
      if (bVar17) goto LAB_0049318f;
    }
    local_58 = local_58 - len;
  } while( true );
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}